

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::AdapterPromiseNode<unsigned_int,_kj::_::PromiseAndFulfillerAdapter<unsigned_int>_>::reject
          (AdapterPromiseNode<unsigned_int,_kj::_::PromiseAndFulfillerAdapter<unsigned_int>_> *this,
          Exception *exception)

{
  ExceptionOr<unsigned_int> local_188;
  
  if (this->waiting == true) {
    this->waiting = false;
    local_188.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_188.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         (exception->ownFile).content.ptr;
    local_188.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         (exception->ownFile).content.size_;
    local_188.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         (exception->ownFile).content.disposer;
    (exception->ownFile).content.ptr = (char *)0x0;
    (exception->ownFile).content.size_ = 0;
    local_188.super_ExceptionOrValue.exception.ptr.field_1.value.file = exception->file;
    local_188.super_ExceptionOrValue.exception.ptr.field_1._32_4_ = exception->line;
    local_188.super_ExceptionOrValue.exception.ptr.field_1._36_4_ = exception->type;
    local_188.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (exception->description).content.ptr;
    local_188.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         (exception->description).content.size_;
    (exception->description).content.ptr = (char *)0x0;
    (exception->description).content.size_ = 0;
    local_188.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         (exception->description).content.disposer;
    local_188.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         (exception->context).ptr.disposer;
    local_188.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr =
         (exception->context).ptr.ptr;
    (exception->context).ptr.ptr = (Context *)0x0;
    memcpy((void *)((long)&local_188.super_ExceptionOrValue.exception.ptr.field_1 + 0x50),
           exception->trace,0x104);
    local_188.value.ptr.isSet = false;
    ExceptionOr<unsigned_int>::operator=(&this->result,&local_188);
    if (local_188.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_188.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }